

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspaksolver.cpp
# Opt level: O2

void __thiscall SparspakSolver::~SparspakSolver(SparspakSolver *this)

{
  (this->super_MatrixSolver)._vptr_MatrixSolver = (_func_int **)&PTR__SparspakSolver_00154b80;
  if (this->perm != (int *)0x0) {
    operator_delete__(this->perm);
  }
  if (this->invp != (int *)0x0) {
    operator_delete__(this->invp);
  }
  if (this->xlnz != (int *)0x0) {
    operator_delete__(this->xlnz);
  }
  if (this->xnzsub != (int *)0x0) {
    operator_delete__(this->xnzsub);
  }
  if (this->nzsub != (int *)0x0) {
    operator_delete__(this->nzsub);
  }
  if (this->xaij != (int *)0x0) {
    operator_delete__(this->xaij);
  }
  if (this->link != (int *)0x0) {
    operator_delete__(this->link);
  }
  if (this->first != (int *)0x0) {
    operator_delete__(this->first);
  }
  if (this->lnz != (double *)0x0) {
    operator_delete__(this->lnz);
  }
  if (this->diag != (double *)0x0) {
    operator_delete__(this->diag);
  }
  if (this->rhs != (double *)0x0) {
    operator_delete__(this->rhs);
  }
  if (this->temp != (double *)0x0) {
    operator_delete__(this->temp);
  }
  MatrixSolver::~MatrixSolver(&this->super_MatrixSolver);
  return;
}

Assistant:

SparspakSolver::~SparspakSolver()
{
    delete [] perm;
    delete [] invp;
    delete [] xlnz;
    delete [] xnzsub;
    delete [] nzsub;
    delete [] xaij;
    delete [] link;
    delete [] first;
    delete [] lnz;
    delete [] diag;
    delete [] rhs;
    delete [] temp;
}